

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::StringPutcMethod::eval
          (StringPutcMethod *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  bool bVar1;
  _Optional_payload_base<unsigned_char> _Var2;
  int *piVar3;
  SVInt *this_00;
  uchar *puVar4;
  EvalContext *pEVar5;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  ConstantValue *in_RDI;
  uint8_t c;
  int32_t index;
  string *str;
  ConstantValue charCv;
  ConstantValue indexCv;
  LValue strCv;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  int iVar6;
  EvalContext *in_stack_fffffffffffffcd0;
  Expression *in_stack_fffffffffffffcd8;
  bitwidth_t bits;
  undefined6 in_stack_fffffffffffffce0;
  SVInt *in_stack_fffffffffffffce8;
  ConstantValue *in_stack_fffffffffffffd20;
  int32_t in_stack_fffffffffffffd2c;
  LValue *in_stack_fffffffffffffd30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_228;
  undefined4 local_21c;
  LValue *in_stack_fffffffffffffe78;
  ConstantValue *in_stack_fffffffffffffec8;
  LValue *in_stack_fffffffffffffed0;
  
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::evalLValue(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,1);
  Expression::eval(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,2);
  Expression::eval(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  bVar1 = LValue::operator_cast_to_bool((LValue *)0xb397aa);
  if (((!bVar1) ||
      (bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xb397c7), !bVar1)) ||
     (bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xb397e4), !bVar1)) {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffcd0,
               (nullptr_t)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    local_21c = 1;
    goto LAB_00b39b29;
  }
  LValue::load(in_stack_fffffffffffffe78);
  slang::ConstantValue::str_abi_cxx11_((ConstantValue *)in_stack_fffffffffffffcd8);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xb3989a);
  local_228 = &local_248;
  slang::ConstantValue::integer((ConstantValue *)0xb398b7);
  SVInt::as<int>(in_stack_fffffffffffffce8);
  piVar3 = std::optional<int>::value((optional<int> *)in_stack_fffffffffffffcd0);
  iVar6 = *piVar3;
  this_00 = slang::ConstantValue::integer((ConstantValue *)0xb3990b);
  _Var2 = (_Optional_payload_base<unsigned_char>)SVInt::as<unsigned_char>(this_00);
  puVar4 = std::optional<unsigned_char>::value((optional<unsigned_char> *)in_stack_fffffffffffffcd0)
  ;
  if ((*puVar4 == '\0') || (iVar6 < 0)) {
LAB_00b39990:
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffcd0,
               (nullptr_t)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  }
  else {
    in_stack_fffffffffffffcd0 = (EvalContext *)(long)iVar6;
    pEVar5 = (EvalContext *)
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                       (local_228);
    bits = (bitwidth_t)((ulong)puVar4 >> 0x20);
    if (pEVar5 <= in_stack_fffffffffffffcd0) goto LAB_00b39990;
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffcd0,
               (nullptr_t)CONCAT44(iVar6,in_stack_fffffffffffffcc8));
    LValue::addIndex(in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,in_stack_fffffffffffffd20);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0xb39a35);
    SVInt::SVInt((SVInt *)CONCAT26(_Var2,in_stack_fffffffffffffce0),bits,
                 (uint64_t)in_stack_fffffffffffffcd0,SUB41((uint)iVar6 >> 0x18,0));
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffcd0,
               (SVInt *)CONCAT44(iVar6,in_stack_fffffffffffffcc8));
    LValue::store(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0xb39a81);
    SVInt::~SVInt((SVInt *)CONCAT26(_Var2,in_stack_fffffffffffffce0));
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffcd0,
               (nullptr_t)CONCAT44(iVar6,in_stack_fffffffffffffcc8));
  }
  local_21c = 1;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcd0);
LAB_00b39b29:
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xb39b36);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xb39b43);
  LValue::~LValue((LValue *)0xb39b50);
  return in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto strCv = args[0]->evalLValue(context);
        auto indexCv = args[1]->eval(context);
        auto charCv = args[2]->eval(context);
        if (!strCv || !indexCv || !charCv)
            return nullptr;

        const std::string& str = strCv.load().str();
        int32_t index = indexCv.integer().as<int32_t>().value();
        uint8_t c = charCv.integer().as<uint8_t>().value();

        if (c == 0 || index < 0 || size_t(index) >= str.length())
            return nullptr;

        strCv.addIndex(index, nullptr);
        strCv.store(SVInt(8, c, false));
        return nullptr;
    }